

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_InvalidEdition_Test::
~ParseEditionsTest_InvalidEdition_Test(ParseEditionsTest_InvalidEdition_Test *this)

{
  ParseEditionsTest_InvalidEdition_Test *this_local;
  
  ~ParseEditionsTest_InvalidEdition_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, InvalidEdition) {
  ExpectHasEarlyExitErrors(
      R"schema(
        edition = "2023_INVALID";
        message A {
          optional int32 b = 1;
        })schema",
      "1:18: Unknown edition \"2023_INVALID\".\n");
}